

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

int xmlListSize(xmlListPtr l)

{
  int iVar1;
  _xmlLink *p_Var2;
  
  if (l != (xmlListPtr)0x0) {
    iVar1 = -1;
    p_Var2 = l->sentinel;
    do {
      p_Var2 = p_Var2->next;
      iVar1 = iVar1 + 1;
    } while (p_Var2 != l->sentinel);
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlListSize(xmlListPtr l)
{
    xmlLinkPtr lk;
    int count=0;

    if (l == NULL)
        return(-1);
    /* TODO: keep a counter in xmlList instead */
    for(lk = l->sentinel->next; lk != l->sentinel; lk = lk->next, count++);
    return count;
}